

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial.h
# Opt level: O2

double __thiscall embree::Averaged<double>::get(Averaged<double> *this)

{
  iterator *this_00;
  double dVar1;
  size_type sVar2;
  reference ppVar3;
  long lVar4;
  size_t i;
  ulong __n;
  double dVar5;
  undefined1 auVar6 [16];
  double local_30;
  
  sVar2 = std::deque<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::size
                    (&this->values);
  if (sVar2 == 0) {
    dVar5 = 0.0;
  }
  else {
    this_00 = &(this->values).
               super__Deque_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
               ._M_impl.super__Deque_impl_data._M_start;
    lVar4 = 0;
    ppVar3 = std::
             _Deque_iterator<std::pair<double,_double>,_std::pair<double,_double>_&,_std::pair<double,_double>_*>
             ::operator[](this_00,0);
    dVar5 = ppVar3->first;
    dVar1 = this->dt;
    local_30 = 0.0;
    __n = 0;
    while( true ) {
      sVar2 = std::deque<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
              size(&this->values);
      if (sVar2 <= __n) break;
      ppVar3 = std::
               _Deque_iterator<std::pair<double,_double>,_std::pair<double,_double>_&,_std::pair<double,_double>_*>
               ::operator[](this_00,__n);
      if (dVar5 - dVar1 <= ppVar3->first) {
        ppVar3 = std::
                 _Deque_iterator<std::pair<double,_double>,_std::pair<double,_double>_&,_std::pair<double,_double>_*>
                 ::operator[](this_00,__n);
        local_30 = local_30 + ppVar3->second;
        lVar4 = lVar4 + 1;
      }
      __n = __n + 1;
    }
    dVar5 = 0.0;
    if (lVar4 != 0) {
      auVar6._8_4_ = (int)((ulong)lVar4 >> 0x20);
      auVar6._0_8_ = lVar4;
      auVar6._12_4_ = 0x45300000;
      dVar5 = local_30 /
              ((auVar6._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0));
    }
  }
  return dVar5;
}

Assistant:

Ty get() const
    {
      if (values.size() == 0) return zero;
      double t_begin = values[0].first-dt;

      Ty sum(zero);
      size_t num(0);
      for (size_t i=0; i<values.size(); i++) {
        if (values[i].first >= t_begin) {
          sum += values[i].second;
          num++;
        }
      }
      if (num == 0) return 0;
      else return sum/Ty(num);
    }